

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::descriptor_unittest::FeaturesDebugStringTest::LoadFile
          (FeaturesDebugStringTest *this,string_view name,string_view content)

{
  string_view v;
  string_view value;
  bool bVar1;
  const_pointer data;
  size_type sVar2;
  char (*v1) [1];
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2;
  char *failure_msg;
  LogMessage *pLVar4;
  uint32_t *puVar5;
  Arena *arena;
  FileDescriptor *pFVar6;
  FileDescriptor *local_350;
  LogMessage local_348;
  Voidify local_331;
  Nullable<const_char_*> local_330;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t sStack_320;
  byte local_311;
  LogMessage local_310;
  Voidify local_2f9;
  undefined1 local_2f8 [8];
  FileDescriptorProto proto;
  Parser parser;
  Tokenizer tokenizer;
  undefined1 local_a8 [8];
  SimpleErrorCollector error_collector;
  ArrayInputStream input_stream;
  FeaturesDebugStringTest *this_local;
  string_view content_local;
  string_view name_local;
  
  content_local._M_len = (size_t)content._M_str;
  this_local = (FeaturesDebugStringTest *)content._M_len;
  content_local._M_str = (char *)name._M_len;
  data = std::basic_string_view<char,_std::char_traits<char>_>::data
                   ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  protobuf::io::ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)((long)&error_collector.last_error_.field_2 + 8),data,(int)sVar2,-1
            );
  SimpleErrorCollector::SimpleErrorCollector((SimpleErrorCollector *)local_a8);
  protobuf::io::Tokenizer::Tokenizer
            ((Tokenizer *)
             &parser.upcoming_detached_comments_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (ZeroCopyInputStream *)((long)&error_collector.last_error_.field_2 + 8),
             (ErrorCollector *)local_a8);
  compiler::Parser::Parser((Parser *)((long)&proto.field_0 + 0xe0));
  compiler::Parser::RecordErrorsTo
            ((Parser *)((long)&proto.field_0 + 0xe0),(ErrorCollector *)local_a8);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_2f8);
  local_311 = 0;
  bVar1 = compiler::Parser::Parse
                    ((Parser *)((long)&proto.field_0 + 0xe0),
                     (Tokenizer *)
                     &parser.upcoming_detached_comments_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (FileDescriptorProto *)local_2f8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_310,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2f05,"parser.Parse(&tokenizer, &proto)");
    local_311 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_310);
    psVar3 = SimpleErrorCollector::last_error_abi_cxx11_((SimpleErrorCollector *)local_a8);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,psVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [2])0x1e65757);
    absl_log_internal_check_op_result = (Nullable<const_char_*>)this_local;
    sStack_320 = content_local._M_len;
    v._M_str = (char *)content_local._M_len;
    v._M_len = (size_t)this_local;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,v);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_2f9,pLVar4);
  }
  if ((local_311 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_310);
  }
  v1 = ::const((char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  psVar3 = SimpleErrorCollector::last_error_abi_cxx11_((SimpleErrorCollector *)local_a8);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<std::__cxx11::string>(psVar3);
  local_330 = absl::lts_20250127::log_internal::Check_EQImpl<char[1],std::__cxx11::string>
                        (v1,v2,"\"\" == error_collector.last_error()");
  if (local_330 == (Nullable<const_char_*>)0x0) {
    puVar5 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)&proto.super_Message.super_MessageLite._internal_metadata_,0);
    *(byte *)puVar5 = (byte)*puVar5 | 1;
    value._M_str = name._M_str;
    value._M_len = (size_t)content_local._M_str;
    arena = protobuf::MessageLite::GetArena((MessageLite *)local_2f8);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)
               &proto.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,value,
               arena);
    local_350 = DescriptorPool::BuildFile(&this->roundtrip_pool_,(FileDescriptorProto *)local_2f8);
    pFVar6 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::FileDescriptor_const*>
                       ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                        ,0x2f0a,"roundtrip_pool_.BuildFile(proto)",&local_350);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_2f8);
    compiler::Parser::~Parser((Parser *)((long)&proto.field_0 + 0xe0));
    protobuf::io::Tokenizer::~Tokenizer
              ((Tokenizer *)
               &parser.upcoming_detached_comments_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SimpleErrorCollector::~SimpleErrorCollector((SimpleErrorCollector *)local_a8);
    protobuf::io::ArrayInputStream::~ArrayInputStream
              ((ArrayInputStream *)((long)&error_collector.last_error_.field_2 + 8));
    return pFVar6;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_330);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_348,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,0x2f08,failure_msg);
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_348);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_331,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_348)
  ;
}

Assistant:

const FileDescriptor* LoadFile(absl::string_view name,
                                 absl::string_view content) {
    io::ArrayInputStream input_stream(content.data(), content.size());
    SimpleErrorCollector error_collector;
    io::Tokenizer tokenizer(&input_stream, &error_collector);
    compiler::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    FileDescriptorProto proto;
    ABSL_CHECK(parser.Parse(&tokenizer, &proto))
        << error_collector.last_error() << "\n"
        << content;
    ABSL_CHECK_EQ("", error_collector.last_error());
    proto.set_name(name);
    return ABSL_DIE_IF_NULL(roundtrip_pool_.BuildFile(proto));
  }